

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Maybe<capnp::schema::Node::Reader> * __thiscall
capnp::compiler::Compiler::Node::resolveFinalSchema
          (Maybe<capnp::schema::Node::Reader> *__return_storage_ptr__,Node *this,uint64_t id)

{
  iterator iVar1;
  Fault f;
  Fault local_10;
  
  local_10.exception = (Exception *)id;
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->module->compiler->nodesById)._M_h,(key_type_conflict *)&local_10);
  if ((iVar1.
       super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (*(Node **)((long)iVar1.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                       ._M_cur + 0x10) != (Node *)0x0)) {
    getFinalSchema(__return_storage_ptr__,
                   *(Node **)((long)iVar1.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                                    ._M_cur + 0x10));
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
            (&local_10,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x3c2,FAILED,(char *)0x0,"\"Tried to get schema for ID we haven\'t seen before.\"",
             (char (*) [51])"Tried to get schema for ID we haven\'t seen before.");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

kj::Maybe<schema::Node::Reader> Compiler::Node::resolveFinalSchema(uint64_t id) {
  KJ_IF_SOME(node, module->getCompiler().findNode(id)) {
    return node.getFinalSchema();
  } else {
    KJ_FAIL_REQUIRE("Tried to get schema for ID we haven't seen before.");
  }
}